

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::makeUnknown(SVInt *this)

{
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar1;
  uint64_t *__src;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *paVar2;
  uint64_t *__s;
  uint uVar3;
  
  if ((this->super_SVIntStorage).unknownFlag == false) {
    uVar3 = (this->super_SVIntStorage).bitWidth + 0x3f >> 6;
    (this->super_SVIntStorage).unknownFlag = true;
    if (uVar3 == 1) {
      aVar1 = (this->super_SVIntStorage).field_0;
      paVar2 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)operator_new__(0x10);
      (this->super_SVIntStorage).field_0.pVal = (uint64_t *)paVar2;
      *paVar2 = aVar1;
      paVar2[1].val = 0;
    }
    else {
      __s = (uint64_t *)operator_new__((ulong)(uVar3 << 4));
      memset(__s,0,(ulong)(uVar3 << 4));
      __src = (this->super_SVIntStorage).field_0.pVal;
      memcpy(__s,__src,(ulong)(uVar3 << 3));
      if (__src != (uint64_t *)0x0) {
        operator_delete__(__src);
      }
      (this->super_SVIntStorage).field_0.pVal = __s;
    }
  }
  return;
}

Assistant:

void SVInt::makeUnknown() {
    if (unknownFlag)
        return;

    uint32_t words = getNumWords();
    unknownFlag = true;
    if (words == 1) {
        auto value = val;
        pVal = new uint64_t[2];
        pVal[0] = value;
        pVal[1] = 0;
    }
    else {
        uint64_t* newMem = new uint64_t[words * 2]();
        memcpy(newMem, pVal, words * WORD_SIZE);
        delete[] pVal;
        pVal = newMem;
    }
}